

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrintValidatorTests.cpp
# Opt level: O3

int testAudioFeatureSoundPrintBasic(void)

{
  bool bVar1;
  ArrayFeatureType *pAVar2;
  FeatureType *this;
  FeatureType *this_00;
  ModelDescription *this_01;
  Type *pTVar3;
  Type *pTVar4;
  ostream *poVar5;
  TypeUnion TVar6;
  AudioFeaturePrint_Sound *pAVar7;
  int iVar8;
  Result result;
  Model model;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this);
  CoreML::Specification::FeatureType::clear_Type(this);
  this->_oneof_case_[0] = 5;
  (this->Type_).multiarraytype_ = pAVar2;
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::clear_Type(this_00);
  this_00->_oneof_case_[0] = 5;
  (this_00->Type_).multiarraytype_ = pAVar2;
  this_01 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_01);
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_01->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_01->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  if (pTVar3->type_ != (FeatureType *)0x0) {
    (*(pTVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar3->type_ = this;
  if (pTVar4->type_ != (FeatureType *)0x0) {
    (*(pTVar4->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar4->type_ = this_00;
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ != (ModelDescription *)0x0) {
    (*((local_58.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  local_58.description_ = this_01;
  CoreML::validate<(MLModelType)2006>((Result *)local_a8,&local_58);
  bVar1 = CoreML::Result::good((Result *)local_a8);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!((result).good())",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    iVar8 = 1;
    std::ostream::flush();
  }
  else {
    if (local_58._oneof_case_[0] != 0x7d6) {
      CoreML::Specification::Model::clear_Type(&local_58);
      local_58._oneof_case_[0] = 0x7d6;
      TVar6.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x20);
      CoreML::Specification::CoreMLModels::AudioFeaturePrint::AudioFeaturePrint
                (TVar6.audiofeatureprint_);
      local_58.Type_.pipelineclassifier_ = TVar6.pipelineclassifier_;
    }
    TVar6 = local_58.Type_;
    CoreML::validate<(MLModelType)2006>((Result *)local_80,&local_58);
    local_a8 = local_80;
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_a8);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!((result).good())",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    else {
      if ((TVar6.treeensembleregressor_)->_cached_size_ != 0x14) {
        CoreML::Specification::CoreMLModels::AudioFeaturePrint::clear_AudioFeaturePrintType
                  (TVar6.audiofeatureprint_);
        (TVar6.treeensembleregressor_)->_cached_size_ = 0x14;
        pAVar7 = (AudioFeaturePrint_Sound *)operator_new(0x18);
        CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound::AudioFeaturePrint_Sound
                  (pAVar7);
        ((AudioFeaturePrintTypeUnion *)&(TVar6.pipelineclassifier_)->pipeline_)->sound_ = pAVar7;
      }
      CoreML::validate<(MLModelType)2006>((Result *)local_80,&local_58);
      local_a8 = local_80;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      bVar1 = CoreML::Result::good((Result *)local_a8);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                   ,0x7f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x31);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!((result).good())",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      }
      else {
        if ((TVar6.treeensembleregressor_)->_cached_size_ == 0x14) {
          pAVar7 = ((AudioFeaturePrintTypeUnion *)&(TVar6.pipelineclassifier_)->pipeline_)->sound_;
        }
        else {
          CoreML::Specification::CoreMLModels::AudioFeaturePrint::clear_AudioFeaturePrintType
                    (TVar6.audiofeatureprint_);
          (TVar6.treeensembleregressor_)->_cached_size_ = 0x14;
          pAVar7 = (AudioFeaturePrint_Sound *)operator_new(0x18);
          CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound::AudioFeaturePrint_Sound
                    (pAVar7);
          ((AudioFeaturePrintTypeUnion *)&(TVar6.pipelineclassifier_)->pipeline_)->sound_ = pAVar7;
        }
        pAVar7->version_ = 1;
        CoreML::validate<(MLModelType)2006>((Result *)local_80,&local_58);
        local_a8 = local_80;
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        bVar1 = CoreML::Result::good((Result *)local_a8);
        iVar8 = 0;
        if (bVar1) goto LAB_0019dafd;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                   ,0x7f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(result).good()",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      }
    }
    std::ostream::put((char)poVar5);
    iVar8 = 1;
    std::ostream::flush();
  }
LAB_0019dafd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return iVar8;
}

Assistant:

int testAudioFeatureSoundPrintBasic() {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *p = model.mutable_audiofeatureprint();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound()->set_version(Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_SOUND_VERSION_1);
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}